

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O0

void __thiscall xmrig::DonateStrategy::idle(DonateStrategy *this,double min,double max)

{
  long in_RDI;
  uint64_t in_stack_ffffffffffffffd8;
  Timer *this_00;
  
  this_00 = *(Timer **)(in_RDI + 0xb8);
  random(*(xmrig **)(in_RDI + 0x70));
  Timer::start(this_00,in_stack_ffffffffffffffd8,0x23c98c);
  return;
}

Assistant:

void xmrig::DonateStrategy::idle(double min, double max)
{
    m_timer->start(random(m_idleTime, min, max), 0);
}